

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cfgable.c
# Opt level: O1

void config_init(OperationConfig *config)

{
  memset(config,0,0x598);
  config->maxredirs = 0x32;
  config->proto_present = false;
  config->proto_redir_present = false;
  config->proto_default = (char *)0x0;
  config->tcp_nodelay = true;
  config->happy_eyeballs_timeout_ms = 200;
  config->http09_allowed = false;
  config->ftp_skip_ip = true;
  config->file_clobber_mode = CLOBBER_DEFAULT;
  curlx_dyn_init(&config->postdata,0x400000000);
  return;
}

Assistant:

void config_init(struct OperationConfig *config)
{
  memset(config, 0, sizeof(struct OperationConfig));

  config->use_httpget = FALSE;
  config->create_dirs = FALSE;
  config->maxredirs = DEFAULT_MAXREDIRS;
  config->proto_present = FALSE;
  config->proto_redir_present = FALSE;
  config->proto_default = NULL;
  config->tcp_nodelay = TRUE; /* enabled by default */
  config->happy_eyeballs_timeout_ms = CURL_HET_DEFAULT;
  config->http09_allowed = FALSE;
  config->ftp_skip_ip = TRUE;
  config->file_clobber_mode = CLOBBER_DEFAULT;
  curlx_dyn_init(&config->postdata, MAX_FILE2MEMORY);
}